

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Editor.cxx
# Opt level: O3

void __thiscall Fl_Text_Editor::add_default_key_bindings(Fl_Text_Editor *this,Key_Binding **list)

{
  int iVar1;
  Key_Func p_Var2;
  Key_Binding *pKVar3;
  int iVar4;
  long lVar5;
  
  iVar4 = 0xff1b;
  lVar5 = 0x10;
  do {
    iVar1 = *(int *)((long)&PTR_as_window_00279720 + lVar5 + 4);
    p_Var2 = *(Key_Func *)((long)&PTR_as_gl_window_00279728 + lVar5);
    pKVar3 = (Key_Binding *)operator_new(0x18);
    pKVar3->key = iVar4;
    pKVar3->state = iVar1;
    pKVar3->function = p_Var2;
    pKVar3->next = *list;
    *list = pKVar3;
    iVar4 = *(int *)((long)&default_key_bindings[0].key + lVar5);
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x300);
  return;
}

Assistant:

void Fl_Text_Editor::add_default_key_bindings(Key_Binding** list) {
  for (int i = 0; default_key_bindings[i].key; i++) {
    add_key_binding(default_key_bindings[i].key,
                    default_key_bindings[i].state,
                    default_key_bindings[i].func,
                    list);
  }
}